

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void ppu_hblank(gba_ppu_t *ppu)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  _Bool *p_Var5;
  ushort uVar6;
  uint uVar7;
  undefined4 extraout_EAX;
  undefined4 uVar8;
  undefined4 extraout_EAX_00;
  uint uVar9;
  DISPCNT_t *pDVar10;
  DISPCNT_t *extraout_RAX;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  int iVar18;
  gba_ppu_t *pgVar19;
  ulong uVar20;
  int x;
  int iVar21;
  int iVar22;
  int iVar23;
  int x_5;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  ushort uVar27;
  byte bVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  _Bool bg_enabled [4];
  _Bool bg_top [6];
  bg_rotation_scaling_t *in_stack_ffffffffffffff28;
  bg_rotation_scaling_t *in_stack_ffffffffffffff38;
  short local_bc;
  byte local_b8;
  byte local_98 [4];
  byte local_94 [4];
  byte local_90;
  byte local_8f;
  byte local_8e [4];
  byte local_8a;
  byte local_89;
  undefined8 local_88;
  gba_ppu_t *local_80;
  ushort local_72;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_60;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  DISPCNT_t *local_48;
  color_t (*local_40) [240];
  ulong local_38;
  undefined1 auVar36 [16];
  undefined1 auVar41 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  short sVar58;
  short sVar59;
  short sVar60;
  
  if (ppu->y < 0xa1 || ppu->y == 0xe3) {
    dma_start_trigger(HBlank);
  }
  uVar6 = (ppu->DISPSTAT).raw;
  if ((uVar6 & 0x10) != 0) {
    request_interrupt(IRQ_HBLANK);
    uVar6 = (ppu->DISPSTAT).raw;
  }
  (ppu->DISPSTAT).raw = uVar6 | 2;
  if (ppu->y < 0xa0) {
    uVar6 = (ppu->DISPCNT).raw;
    uVar17 = (uint)uVar6;
    if (-1 < (char)uVar6) {
      local_48 = &ppu->DISPCNT;
      uVar7 = uVar17 & 7;
      if (4 < uVar7) goto LAB_0011b0c5;
      pDVar10 = (DISPCNT_t *)
                ((long)&switchD_00118562::switchdataD_00127070 +
                (long)(int)(&switchD_00118562::switchdataD_00127070)[uVar7]);
      uVar8 = SUB84(pDVar10,0);
      local_80 = ppu;
      switch(uVar7) {
      case 0:
        if ((uVar6 >> 0xc & 1) != 0) {
          render_obj(ppu);
          uVar17 = (uint)(ppu->DISPCNT).raw;
        }
        if ((uVar17 >> 8 & 1) != 0) {
          uVar6 = (ppu->WININ).raw;
          local_88 = CONCAT44(local_88._4_4_,(uint)(uVar6 >> 8)) & 0xffffffff00000001;
          uVar27 = (ppu->WINOUT).raw;
          local_68 = CONCAT44(local_68._4_4_,(uint)(uVar27 >> 8)) & 0xffffffff00000001;
          uVar1 = ppu->y;
          uVar2 = (ppu->WIN0H).raw;
          uVar3 = (ppu->WIN1H).raw;
          local_60 = (ulong)(((uint)(ppu->BG0VOFS).raw + (uint)uVar1 & 7) << 3);
          local_b8 = (byte)(uVar17 >> 0xe) & 1;
          local_70 = (ulong)(ppu->BG0HOFS).raw;
          uVar29 = 0;
          do {
            if ((uVar2 & 0xff) < uVar29 || uVar29 < uVar2 >> 8) {
              bVar30 = false;
            }
            else {
              bVar30 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
            }
            if ((uVar3 & 0xff) < uVar29 || uVar29 < uVar3 >> 8) {
              bVar11 = false;
            }
            else {
              bVar11 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
            }
            uVar7 = (uint)uVar6;
            if (((((byte)(uVar17 >> 0xd) & 1 & bVar30) == 0) &&
                (uVar7 = (uint)local_88, (local_b8 & bVar11) == 0)) &&
               ((local_bc = (short)uVar17, -1 < local_bc ||
                (uVar7 = (uint)local_68, ppu->obj_window[uVar29] == false)))) {
              if (((bVar30 != false || bVar11 != false) || (uVar17 & 0x6000) == 0) ||
                  (uVar27 & 1) != 0) {
LAB_00118703:
                (*(code *)(&DAT_001270e4 +
                          *(int *)(&DAT_001270e4 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4)))();
                return;
              }
            }
            else if ((uVar7 & 1) != 0) goto LAB_00118703;
            ppu->bgbuf[0][uVar29].raw = *(ushort *)ppu->pram | 0x8000;
            uVar29 = uVar29 + 1;
          } while (uVar29 != 0xf0);
          uVar17 = (uint)local_48->raw;
        }
        if ((uVar17 >> 9 & 1) != 0) {
          uVar6 = (ppu->WININ).raw;
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff00000002;
          uVar27 = (ppu->WINOUT).raw;
          local_68 = CONCAT44(local_68._4_4_,(uint)uVar27) & 0xffffffff00000200;
          local_88 = CONCAT44(local_88._4_4_,((ppu->BG1CNT).raw & 0x1f00) << 3);
          uVar1 = ppu->y;
          uVar2 = (ppu->WIN0H).raw;
          uVar3 = (ppu->WIN1H).raw;
          local_60 = (ulong)(((uint)(ppu->BG1VOFS).raw + (uint)uVar1 & 7) << 3);
          local_b8 = (byte)(uVar17 >> 0xe) & 1;
          uVar29 = 0;
          do {
            if ((uVar2 & 0xff) < uVar29 || uVar29 < uVar2 >> 8) {
              bVar30 = false;
            }
            else {
              bVar30 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
            }
            if ((uVar3 & 0xff) < uVar29 || uVar29 < uVar3 >> 8) {
              bVar11 = false;
            }
            else {
              bVar11 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
            }
            uVar16 = (ushort)local_70;
            if (((((byte)(uVar17 >> 0xd) & 1 & bVar30) == 0) &&
                (uVar16 = uVar6 & 0x200, (local_b8 & bVar11) == 0)) &&
               ((local_bc = (short)uVar17, -1 < local_bc ||
                (uVar16 = (ushort)local_68, ppu->obj_window[uVar29] == false)))) {
              if (((bVar30 != false || bVar11 != false) || (uVar17 & 0x6000) == 0) ||
                  ((byte)uVar27 >> 1 & 1) != 0) {
LAB_001189e4:
                (*(code *)(&DAT_001270f4 +
                          *(int *)(&DAT_001270f4 + (ulong)((ppu->BG1CNT).raw >> 0xe) * 4)))();
                return;
              }
            }
            else if (uVar16 != 0) goto LAB_001189e4;
            ppu->bgbuf[1][uVar29].raw = *(ushort *)ppu->pram | 0x8000;
            uVar29 = uVar29 + 1;
          } while (uVar29 != 0xf0);
          uVar17 = (uint)local_48->raw;
        }
        if ((uVar17 >> 10 & 1) != 0) {
          uVar6 = (ppu->WININ).raw;
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff00000004;
          uVar27 = (ppu->WINOUT).raw;
          local_68 = CONCAT44(local_68._4_4_,(uint)uVar27) & 0xffffffff00000400;
          local_88 = CONCAT44(local_88._4_4_,((ppu->BG2CNT).raw & 0x1f00) << 3);
          uVar1 = ppu->y;
          uVar2 = (ppu->WIN0H).raw;
          uVar3 = (ppu->WIN1H).raw;
          local_60 = (ulong)(((uint)(ppu->BG2VOFS).raw + (uint)uVar1 & 7) << 3);
          local_b8 = (byte)(uVar17 >> 0xe) & 1;
          uVar29 = 0;
          do {
            if ((uVar2 & 0xff) < uVar29 || uVar29 < uVar2 >> 8) {
              bVar30 = false;
            }
            else {
              bVar30 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
            }
            if ((uVar3 & 0xff) < uVar29 || uVar29 < uVar3 >> 8) {
              bVar11 = false;
            }
            else {
              bVar11 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
            }
            uVar16 = (ushort)local_70;
            if (((((byte)(uVar17 >> 0xd) & 1 & bVar30) == 0) &&
                (uVar16 = uVar6 & 0x400, (local_b8 & bVar11) == 0)) &&
               ((local_bc = (short)uVar17, -1 < local_bc ||
                (uVar16 = (ushort)local_68, ppu->obj_window[uVar29] == false)))) {
              if (((bVar30 != false || bVar11 != false) || (uVar17 & 0x6000) == 0) ||
                  ((byte)uVar27 >> 2 & 1) != 0) {
LAB_00118cbf:
                (*(code *)(&DAT_00127104 +
                          *(int *)(&DAT_00127104 + (ulong)((ppu->BG2CNT).raw >> 0xe) * 4)))();
                return;
              }
            }
            else if (uVar16 != 0) goto LAB_00118cbf;
            ppu->bgbuf[2][uVar29].raw = *(ushort *)ppu->pram | 0x8000;
            uVar29 = uVar29 + 1;
          } while (uVar29 != 0xf0);
          uVar17 = (uint)local_48->raw;
        }
        if ((uVar17 >> 0xb & 1) != 0) {
          uVar6 = (ppu->WININ).raw;
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff00000008;
          uVar27 = (ppu->WINOUT).raw;
          local_68 = CONCAT44(local_68._4_4_,(uint)uVar27) & 0xffffffff00000800;
          local_88 = CONCAT44(local_88._4_4_,((ppu->BG3CNT).raw & 0x1f00) << 3);
          uVar1 = ppu->y;
          uVar2 = (ppu->WIN0H).raw;
          uVar3 = (ppu->WIN1H).raw;
          local_60 = (ulong)(((uint)(ppu->BG3VOFS).raw + (uint)uVar1 & 7) << 3);
          local_b8 = (byte)(uVar17 >> 0xe) & 1;
          uVar29 = 0;
          do {
            if ((uVar2 & 0xff) < uVar29 || uVar29 < uVar2 >> 8) {
              bVar30 = false;
            }
            else {
              bVar30 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
            }
            if ((uVar3 & 0xff) < uVar29 || uVar29 < uVar3 >> 8) {
              bVar11 = false;
            }
            else {
              bVar11 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
            }
            uVar16 = (ushort)local_70;
            if (((((byte)(uVar17 >> 0xd) & 1 & bVar30) == 0) &&
                (uVar16 = uVar6 & 0x800, (local_b8 & bVar11) == 0)) &&
               ((local_bc = (short)uVar17, -1 < local_bc ||
                (uVar16 = (ushort)local_68, ppu->obj_window[uVar29] == false)))) {
              if (((bVar30 != false || bVar11 != false) || (uVar17 & 0x6000) == 0) ||
                  ((byte)uVar27 >> 3 & 1) != 0) {
LAB_00118f9d:
                (*(code *)(&DAT_00127114 +
                          *(int *)(&DAT_00127114 + (ulong)((ppu->BG3CNT).raw >> 0xe) * 4)))();
                return;
              }
            }
            else if (uVar16 != 0) goto LAB_00118f9d;
            ppu->bgbuf[3][uVar29].raw = *(ushort *)ppu->pram | 0x8000;
            uVar29 = uVar29 + 1;
          } while (uVar29 != 0xf0);
        }
        uVar29 = 0;
        dbg_line_drawn();
        refresh_background_priorities(ppu);
        uVar7 = (ppu->BLDALPHA).raw & 0x1f;
        uVar17 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
        local_4c = (ppu->BLDY).raw & 0x1f;
        if (0xf < (ushort)local_4c) {
          local_4c = 0x10;
        }
        bVar15 = (byte)((ppu->DISPCNT).raw >> 8);
        local_98[0] = bVar15 & 1;
        local_98[1] = bVar15 >> 1 & 1;
        local_98[2] = bVar15 >> 2 & 1;
        local_98[3] = bVar15 >> 3 & 1;
        bVar15 = (byte)(ppu->BLDCNT).raw;
        local_8e[0] = bVar15 & 1;
        local_8e[1] = bVar15 >> 1 & 1;
        local_8e[2] = bVar15 >> 2 & 1;
        local_8e[3] = bVar15 >> 3 & 1;
        local_8a = bVar15 >> 4 & 1;
        local_89 = bVar15 >> 5 & 1;
        bVar15 = (byte)((ppu->BLDCNT).raw >> 8);
        local_94[0] = bVar15 & 1;
        local_94[1] = bVar15 >> 1 & 1;
        local_94[2] = bVar15 >> 2 & 1;
        local_94[3] = bVar15 >> 3 & 1;
        local_90 = bVar15 >> 4 & 1;
        local_8f = bVar15 >> 5 & 1;
        local_72 = *(ushort *)ppu->pram;
        local_38 = (ulong)ppu->y;
        uVar12 = (uint)(byte)(0x10 - (char)local_4c);
        if (0xf < (ushort)uVar17) {
          uVar17 = 0x10;
        }
        if (0xf < (ushort)uVar7) {
          uVar7 = 0x10;
        }
        local_40 = ppu->screen;
        pgVar19 = ppu;
        uVar20 = local_38;
        do {
          uVar6 = (ushort)uVar20;
          if ((byte)(pgVar19->WIN0H).raw < uVar29 || uVar29 < (pgVar19->WIN0H).raw >> 8) {
            bVar30 = false;
          }
          else {
            bVar30 = uVar6 <= ((pgVar19->WIN0V).raw & 0xff) && (pgVar19->WIN0V).raw >> 8 <= uVar6;
          }
          if ((byte)(pgVar19->WIN1H).raw < uVar29 || uVar29 < (pgVar19->WIN1H).raw >> 8) {
            bVar11 = false;
          }
          else {
            bVar11 = uVar6 <= ((pgVar19->WIN1V).raw & 0xff) && (pgVar19->WIN1V).raw >> 8 <= uVar6;
          }
          uVar6 = local_48->raw;
          bVar15 = (byte)(uVar6 >> 8);
          if ((bVar15 >> 5 & 1 & bVar30) == 1) {
            bVar15 = *(byte *)&pgVar19->WININ;
LAB_001192d8:
            uVar27 = (ushort)(bVar15 >> 5);
          }
          else {
            if ((bVar15 >> 6 & 1 & bVar11) == 1) {
              uVar27 = (pgVar19->WININ).raw;
            }
            else {
              if (((short)uVar6 < 0 & pgVar19->obj_window[uVar29]) != 1) {
                uVar27 = 1;
                if ((uVar6 & 0x6000) != 0 && (bVar30 == false && bVar11 == false)) {
                  bVar15 = *(byte *)&pgVar19->WINOUT;
                  goto LAB_001192d8;
                }
                goto LAB_0011931e;
              }
              uVar27 = (pgVar19->WINOUT).raw;
            }
            uVar27 = uVar27 >> 0xd;
          }
LAB_0011931e:
          uVar6 = (pgVar19->BLDCNT).raw;
          uVar13 = uVar6 >> 6 & 3;
          p_Var5 = pgVar19->obj_alpha;
          local_60 = CONCAT71(local_60._1_7_,p_Var5[uVar29]);
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff000000c0;
          iVar21 = (black.raw & 0x1f) * local_4c;
          iVar22 = (black.raw >> 5 & 0x1f) * local_4c;
          iVar18 = (black.raw >> 10 & 0x1f) * local_4c;
          local_54 = (white.raw & 0x1f) * local_4c;
          local_58 = (white.raw >> 5 & 0x1f) * local_4c;
          local_50 = (white.raw >> 10 & 0x1f) * local_4c;
          iVar23 = 5;
          uVar20 = 3;
          local_68 = (ulong)uVar13;
          uVar25 = (uint)local_72;
          uVar14 = (uint)local_72;
          local_88 = uVar29;
          do {
            iVar4 = background_priorities[uVar20];
            bVar15 = local_94[iVar23];
            local_bc._0_1_ = (char)uVar6;
            if ((uVar27 & 1) == 0) {
              bVar24 = (char)local_bc < '\0' | bVar15;
              uVar1 = ppu->bgbuf[iVar4][uVar29].raw;
              uVar9 = (uint)uVar1;
              bVar28 = -1 < (short)uVar1 & local_98[iVar4];
joined_r0x00119549:
              uVar26 = uVar14;
              if (bVar28 != 0) {
                uVar26 = uVar9;
                iVar23 = iVar4;
                uVar25 = uVar9;
              }
            }
            else {
              bVar24 = (char)local_bc < '\0' | bVar15;
              uVar1 = ppu->bgbuf[iVar4][uVar29].raw;
              uVar9 = (uint)uVar1;
              bVar28 = -1 < (short)uVar1 & local_98[iVar4];
              pgVar19 = local_80;
              if (((bVar28 != 1) || (local_8e[iVar4] == 0)) ||
                 ((char)local_bc >= '\0' && ((short)local_70 == 0x40 & bVar15) == 0))
              goto joined_r0x00119549;
              uVar26 = (uint)uVar1;
              switch(uVar13) {
              case 0:
                goto switchD_00119473_caseD_11b0ac;
              case 1:
                uVar25 = (uVar26 & 0x1f) * uVar7 + (uVar14 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 5 & 0x1f) * uVar7 + (uVar14 >> 5 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar9) {
                  uVar9 = 0x1f;
                }
                uVar14 = (uVar1 >> 10) * uVar7 + (uVar14 >> 10 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = uVar14 << 10 | uVar9 << 5 | uVar25;
                iVar23 = iVar4;
                goto LAB_0011966d;
              case 2:
                uVar14 = (uVar9 & 0x1f) * uVar12 + local_54 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + local_58 >> 4;
                if (0x1e < uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 10) * uVar12 + local_50;
                break;
              case 3:
                uVar14 = (uVar9 & 0x1f) * uVar12 + iVar21 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + iVar22 >> 4;
                if (0x1e < uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 10) * uVar12 + iVar18;
              }
              uVar9 = uVar9 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar25 = uVar14 | uVar9 << 10 | uVar25 << 5;
              iVar23 = iVar4;
            }
LAB_0011966d:
            uVar14 = uVar26;
            if (uVar20 == pgVar19->obj_priorities[uVar29]) {
              uVar1 = pgVar19->objbuf[uVar29].raw;
              bVar30 = -1 < (short)uVar1;
              uVar9 = (uint)uVar1;
              if (bVar30) {
                uVar25 = uVar9;
              }
              if (bVar30) {
                uVar14 = uVar9;
                iVar23 = 4;
              }
              if ((bVar30 & p_Var5[uVar29] & bVar24) == 1) {
                if (bVar15 == 0) {
                  switch(uVar13) {
                  case 0:
                    goto switchD_001196cf_caseD_11b0b6;
                  case 1:
                    goto switchD_001196cf_caseD_1196d1;
                  case 2:
                    uVar14 = (uVar1 & 0x1f) * uVar12 + local_54 >> 4;
                    if (0x1e < uVar14) {
                      uVar14 = 0x1f;
                    }
                    uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + local_58 >> 4;
                    if (0x1e < uVar25) {
                      uVar25 = 0x1f;
                    }
                    uVar9 = (uVar1 >> 10) * uVar12 + local_50;
                    break;
                  case 3:
                    uVar14 = (uVar9 & 0x1f) * uVar12 + iVar21 >> 4;
                    if (0x1e < uVar14) {
                      uVar14 = 0x1f;
                    }
                    uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + iVar22 >> 4;
                    if (0x1e < uVar25) {
                      uVar25 = 0x1f;
                    }
                    uVar9 = (uVar1 >> 10) * uVar12 + iVar18;
                  }
                  uVar9 = uVar9 >> 4;
                  if (0x1e < uVar9) {
                    uVar9 = 0x1f;
                  }
                  uVar25 = uVar14 | uVar9 << 10 | uVar25 << 5;
                }
                else {
switchD_001196cf_caseD_1196d1:
                  uVar14 = (uVar1 & 0x1f) * uVar7 + (uVar26 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar14) {
                    uVar14 = 0x1f;
                  }
                  uVar25 = (uVar1 >> 5 & 0x1f) * uVar7 + (uVar26 >> 5 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar25) {
                    uVar25 = 0x1f;
                  }
                  uVar9 = (uVar1 >> 10) * uVar7 + (uVar26 >> 10 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar9) {
                    uVar9 = 0x1f;
                  }
                  uVar25 = uVar9 << 10 | uVar25 << 5 | uVar14;
                }
                iVar23 = 4;
                uVar14 = (uint)uVar1;
              }
            }
            bVar30 = uVar20 != 0;
            uVar20 = uVar20 - 1;
          } while (bVar30);
          local_40[local_38][uVar29].a = 0xff;
          local_40[local_38][uVar29].r = ((byte)uVar25 & 7) + (byte)uVar25 * '\b';
          bVar15 = (byte)((uVar25 & 0xffff) >> 5);
          local_40[local_38][uVar29].g = (bVar15 & 7) + bVar15 * '\b';
          bVar15 = (byte)((uVar25 & 0xffff) >> 10);
          local_40[local_38][uVar29].b = (bVar15 & 7) + bVar15 * '\b';
          uVar29 = uVar29 + 1;
          uVar20 = local_38;
        } while (uVar29 != 0xf0);
        break;
      case 1:
        if ((uVar6 >> 0xc & 1) != 0) {
          render_obj(ppu);
          uVar17 = (uint)(ppu->DISPCNT).raw;
          pDVar10 = extraout_RAX;
        }
        pgVar19 = local_80;
        if ((uVar17 >> 8 & 1) != 0) {
          uVar6 = (ppu->WININ).raw;
          local_88 = CONCAT44(local_88._4_4_,(uint)(uVar6 >> 8)) & 0xffffffff00000001;
          uVar27 = (ppu->WINOUT).raw;
          local_68 = CONCAT44(local_68._4_4_,(uint)(uVar27 >> 8)) & 0xffffffff00000001;
          uVar1 = ppu->y;
          uVar2 = (ppu->WIN0H).raw;
          uVar3 = (ppu->WIN1H).raw;
          local_60 = (ulong)(((uint)(ppu->BG0VOFS).raw + (uint)uVar1 & 7) << 3);
          local_b8 = (byte)(uVar17 >> 0xe) & 1;
          local_70 = (ulong)(ppu->BG0HOFS).raw;
          uVar29 = 0;
          do {
            if ((uVar2 & 0xff) < uVar29 || uVar29 < uVar2 >> 8) {
              bVar30 = false;
            }
            else {
              bVar30 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
            }
            if ((uVar3 & 0xff) < uVar29 || uVar29 < uVar3 >> 8) {
              bVar11 = false;
            }
            else {
              bVar11 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
            }
            uVar7 = (uint)uVar6;
            if (((((byte)(uVar17 >> 0xd) & 1 & bVar30) == 0) &&
                (uVar7 = (uint)local_88, (local_b8 & bVar11) == 0)) &&
               ((local_bc = (short)uVar17, -1 < local_bc ||
                (uVar7 = (uint)local_68, ppu->obj_window[uVar29] == false)))) {
              if (((bVar30 != false || bVar11 != false) || (uVar17 & 0x6000) == 0) ||
                  (uVar27 & 1) != 0) {
LAB_0011a3e1:
                (*(code *)(&DAT_001270a4 +
                          *(int *)(&DAT_001270a4 + (ulong)((ppu->BG0CNT).raw >> 0xe) * 4)))();
                return;
              }
            }
            else if ((uVar7 & 1) != 0) goto LAB_0011a3e1;
            ppu->bgbuf[0][uVar29].raw = *(ushort *)ppu->pram | 0x8000;
            uVar29 = uVar29 + 1;
          } while (uVar29 != 0xf0);
          uVar17 = (uint)local_48->raw;
          pDVar10 = local_48;
        }
        if ((uVar17 >> 9 & 1) != 0) {
          uVar6 = (ppu->WININ).raw;
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff00000002;
          uVar27 = (ppu->WINOUT).raw;
          local_68 = CONCAT44(local_68._4_4_,(uint)uVar27) & 0xffffffff00000200;
          local_88 = CONCAT44(local_88._4_4_,((ppu->BG1CNT).raw & 0x1f00) << 3);
          uVar1 = ppu->y;
          uVar2 = (ppu->WIN0H).raw;
          uVar3 = (ppu->WIN1H).raw;
          local_60 = (ulong)(((uint)(ppu->BG1VOFS).raw + (uint)uVar1 & 7) << 3);
          local_b8 = (byte)(uVar17 >> 0xe) & 1;
          uVar29 = 0;
          do {
            if ((uVar2 & 0xff) < uVar29 || uVar29 < uVar2 >> 8) {
              bVar30 = false;
            }
            else {
              bVar30 = uVar1 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar1;
            }
            if ((uVar3 & 0xff) < uVar29 || uVar29 < uVar3 >> 8) {
              bVar11 = false;
            }
            else {
              bVar11 = uVar1 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar1;
            }
            uVar16 = (ushort)local_70;
            if (((((byte)(uVar17 >> 0xd) & 1 & bVar30) == 0) &&
                (uVar16 = uVar6 & 0x200, (local_b8 & bVar11) == 0)) &&
               ((local_bc = (short)uVar17, -1 < local_bc ||
                (uVar16 = (ushort)local_68, ppu->obj_window[uVar29] == false)))) {
              if (((bVar30 != false || bVar11 != false) || (uVar17 & 0x6000) == 0) ||
                  ((byte)uVar27 >> 1 & 1) != 0) {
LAB_0011a6c6:
                (*(code *)(&DAT_001270b4 +
                          *(int *)(&DAT_001270b4 + (ulong)((ppu->BG1CNT).raw >> 0xe) * 4)))();
                return;
              }
            }
            else if (uVar16 != 0) goto LAB_0011a6c6;
            ppu->bgbuf[1][uVar29].raw = *(ushort *)ppu->pram | 0x8000;
            uVar29 = uVar29 + 1;
          } while (uVar29 != 0xf0);
          uVar17 = (uint)local_48->raw;
          pDVar10 = local_48;
        }
        if ((uVar17 >> 10 & 1) != 0) {
          uVar12._0_2_ = ppu->WININ;
          uVar12._2_2_ = ppu->WINOUT;
          auVar31 = pshuflw(ZEXT416(uVar12),ZEXT416(uVar12),5);
          auVar45 = ZEXT816(0x4040000040400);
          sVar60 = auVar45._6_2_;
          auVar57._0_12_ = auVar45._0_12_;
          auVar57._12_2_ = sVar60;
          auVar57._14_2_ = sVar60;
          sVar59 = auVar45._4_2_;
          auVar56._12_4_ = auVar57._12_4_;
          auVar56._0_10_ = auVar45._0_10_;
          auVar56._10_2_ = sVar59;
          auVar55._10_6_ = auVar56._10_6_;
          auVar55._8_2_ = sVar59;
          auVar55._0_8_ = 0x4040000040400;
          sVar58 = auVar45._2_2_;
          auVar54._8_8_ = auVar55._8_8_;
          auVar54._6_2_ = sVar58;
          auVar54._4_2_ = sVar58;
          auVar54._0_2_ = auVar45._0_2_;
          auVar54._2_2_ = auVar54._0_2_;
          auVar42._0_12_ = auVar31._0_12_;
          auVar42._12_2_ = auVar31._6_2_;
          auVar42._14_2_ = auVar31._6_2_;
          auVar41._12_4_ = auVar42._12_4_;
          auVar41._0_10_ = auVar31._0_10_;
          auVar41._10_2_ = auVar31._4_2_;
          auVar40._10_6_ = auVar41._10_6_;
          auVar40._0_8_ = auVar31._0_8_;
          auVar40._8_2_ = auVar31._4_2_;
          auVar43._8_8_ = auVar40._8_8_;
          auVar43._6_2_ = auVar31._2_2_;
          auVar43._4_2_ = auVar31._2_2_;
          auVar43._0_2_ = auVar31._0_2_;
          auVar43._2_2_ = auVar43._0_2_;
          auVar43 = auVar43 & auVar54;
          auVar44._0_2_ = -(ushort)(auVar43._0_2_ == auVar54._0_2_);
          auVar44._2_2_ = -(ushort)(auVar43._2_2_ == auVar54._0_2_);
          auVar44._4_2_ = -(ushort)(auVar43._4_2_ == sVar58);
          auVar44._6_2_ = -(ushort)(auVar43._6_2_ == sVar58);
          auVar44._8_2_ = -(ushort)(auVar43._8_2_ == sVar59);
          auVar44._10_2_ = -(ushort)(auVar43._10_2_ == sVar59);
          auVar44._12_2_ = -(ushort)(auVar43._12_2_ == sVar60);
          auVar44._14_2_ = -(ushort)(auVar43._14_2_ == sVar60);
          uVar8 = movmskps((int)pDVar10,auVar44);
          bVar15 = (byte)uVar8;
          render_bg_affine(local_80,ppu->bgbuf + 2,&ppu->BG2CNT,(_Bool)(bVar15 >> 3),
                           (_Bool)((bVar15 & 4) >> 2),(_Bool)((bVar15 & 2) >> 1),(_Bool)(bVar15 & 1)
                           ,&ppu->BG2X,&ppu->BG2Y,&ppu->BG2PA,in_stack_ffffffffffffff28,
                           &local_80->BG2PC,in_stack_ffffffffffffff38);
          ppu = pgVar19;
        }
        uVar29 = 0;
        dbg_line_drawn();
        refresh_background_priorities(ppu);
        uVar7 = (ppu->BLDALPHA).raw & 0x1f;
        uVar17 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
        local_4c = (ppu->BLDY).raw & 0x1f;
        if (0xf < (ushort)local_4c) {
          local_4c = 0x10;
        }
        bVar15 = (byte)((ppu->DISPCNT).raw >> 8);
        local_98[0] = bVar15 & 1;
        local_98[1] = bVar15 >> 1 & 1;
        local_98[2] = bVar15 >> 2 & 1;
        local_98[3] = bVar15 >> 3 & 1;
        bVar15 = (byte)(ppu->BLDCNT).raw;
        local_8e[0] = bVar15 & 1;
        local_8e[1] = bVar15 >> 1 & 1;
        local_8e[2] = bVar15 >> 2 & 1;
        local_8e[3] = bVar15 >> 3 & 1;
        local_8a = bVar15 >> 4 & 1;
        local_89 = bVar15 >> 5 & 1;
        bVar15 = (byte)((ppu->BLDCNT).raw >> 8);
        local_94[0] = bVar15 & 1;
        local_94[1] = bVar15 >> 1 & 1;
        local_94[2] = bVar15 >> 2 & 1;
        local_94[3] = bVar15 >> 3 & 1;
        local_90 = bVar15 >> 4 & 1;
        local_8f = bVar15 >> 5 & 1;
        local_72 = *(ushort *)ppu->pram;
        local_38 = (ulong)ppu->y;
        uVar12 = (uint)(byte)(0x10 - (char)local_4c);
        if (0xf < (ushort)uVar17) {
          uVar17 = 0x10;
        }
        if (0xf < (ushort)uVar7) {
          uVar7 = 0x10;
        }
        local_40 = ppu->screen;
        pgVar19 = ppu;
        uVar20 = local_38;
        do {
          uVar6 = (ushort)uVar20;
          if ((byte)(pgVar19->WIN0H).raw < uVar29 || uVar29 < (pgVar19->WIN0H).raw >> 8) {
            bVar30 = false;
          }
          else {
            bVar30 = uVar6 <= ((pgVar19->WIN0V).raw & 0xff) && (pgVar19->WIN0V).raw >> 8 <= uVar6;
          }
          if ((byte)(pgVar19->WIN1H).raw < uVar29 || uVar29 < (pgVar19->WIN1H).raw >> 8) {
            bVar11 = false;
          }
          else {
            bVar11 = uVar6 <= ((pgVar19->WIN1V).raw & 0xff) && (pgVar19->WIN1V).raw >> 8 <= uVar6;
          }
          uVar6 = local_48->raw;
          bVar15 = (byte)(uVar6 >> 8);
          if ((bVar15 >> 5 & 1 & bVar30) == 1) {
            bVar15 = *(byte *)&pgVar19->WININ;
LAB_0011aab8:
            uVar27 = (ushort)(bVar15 >> 5);
          }
          else {
            if ((bVar15 >> 6 & 1 & bVar11) == 1) {
              uVar27 = (pgVar19->WININ).raw;
            }
            else {
              if (((short)uVar6 < 0 & pgVar19->obj_window[uVar29]) != 1) {
                uVar27 = 1;
                if ((uVar6 & 0x6000) != 0 && (bVar30 == false && bVar11 == false)) {
                  bVar15 = *(byte *)&pgVar19->WINOUT;
                  goto LAB_0011aab8;
                }
                goto LAB_0011aafe;
              }
              uVar27 = (pgVar19->WINOUT).raw;
            }
            uVar27 = uVar27 >> 0xd;
          }
LAB_0011aafe:
          uVar6 = (pgVar19->BLDCNT).raw;
          uVar13 = uVar6 >> 6 & 3;
          p_Var5 = pgVar19->obj_alpha;
          local_60 = CONCAT71(local_60._1_7_,p_Var5[uVar29]);
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff000000c0;
          iVar21 = (black.raw & 0x1f) * local_4c;
          iVar22 = (black.raw >> 5 & 0x1f) * local_4c;
          iVar18 = (black.raw >> 10 & 0x1f) * local_4c;
          local_54 = (white.raw & 0x1f) * local_4c;
          local_58 = (white.raw >> 5 & 0x1f) * local_4c;
          local_50 = (white.raw >> 10 & 0x1f) * local_4c;
          iVar23 = 5;
          uVar20 = 3;
          local_68 = (ulong)uVar13;
          uVar25 = (uint)local_72;
          uVar14 = (uint)local_72;
          local_88 = uVar29;
          do {
            iVar4 = background_priorities[uVar20];
            bVar15 = local_94[iVar23];
            local_bc._0_1_ = (char)uVar6;
            if ((uVar27 & 1) == 0) {
              bVar24 = (char)local_bc < '\0' | bVar15;
              uVar1 = ppu->bgbuf[iVar4][uVar29].raw;
              uVar9 = (uint)uVar1;
              bVar28 = -1 < (short)uVar1 & local_98[iVar4];
joined_r0x0011ad29:
              uVar26 = uVar14;
              if (bVar28 != 0) {
                uVar26 = uVar9;
                iVar23 = iVar4;
                uVar25 = uVar9;
              }
            }
            else {
              bVar24 = (char)local_bc < '\0' | bVar15;
              uVar1 = ppu->bgbuf[iVar4][uVar29].raw;
              uVar9 = (uint)uVar1;
              bVar28 = -1 < (short)uVar1 & local_98[iVar4];
              pgVar19 = local_80;
              if (((bVar28 != 1) || (local_8e[iVar4] == 0)) ||
                 ((char)local_bc >= '\0' && ((short)local_70 == 0x40 & bVar15) == 0))
              goto joined_r0x0011ad29;
              uVar26 = (uint)uVar1;
              switch(uVar13) {
              case 0:
                goto switchD_0011ac53_caseD_11b0b1;
              case 1:
                uVar25 = (uVar26 & 0x1f) * uVar7 + (uVar14 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 5 & 0x1f) * uVar7 + (uVar14 >> 5 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar9) {
                  uVar9 = 0x1f;
                }
                uVar14 = (uVar1 >> 10) * uVar7 + (uVar14 >> 10 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = uVar14 << 10 | uVar9 << 5 | uVar25;
                iVar23 = iVar4;
                goto LAB_0011ae4d;
              case 2:
                uVar14 = (uVar9 & 0x1f) * uVar12 + local_54 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + local_58 >> 4;
                if (0x1e < uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 10) * uVar12 + local_50;
                break;
              case 3:
                uVar14 = (uVar9 & 0x1f) * uVar12 + iVar21 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + iVar22 >> 4;
                if (0x1e < uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 10) * uVar12 + iVar18;
              }
              uVar9 = uVar9 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar25 = uVar14 | uVar9 << 10 | uVar25 << 5;
              iVar23 = iVar4;
            }
LAB_0011ae4d:
            uVar14 = uVar26;
            if (uVar20 == pgVar19->obj_priorities[uVar29]) {
              uVar1 = pgVar19->objbuf[uVar29].raw;
              bVar30 = -1 < (short)uVar1;
              uVar9 = (uint)uVar1;
              if (bVar30) {
                uVar25 = uVar9;
              }
              if (bVar30) {
                uVar14 = uVar9;
                iVar23 = 4;
              }
              if ((bVar30 & p_Var5[uVar29] & bVar24) == 1) {
                if (bVar15 == 0) {
                  switch(uVar13) {
                  case 0:
                    goto switchD_0011aeaf_caseD_11b0c0;
                  case 1:
                    goto switchD_0011aeaf_caseD_11aeb1;
                  case 2:
                    uVar14 = (uVar1 & 0x1f) * uVar12 + local_54 >> 4;
                    if (0x1e < uVar14) {
                      uVar14 = 0x1f;
                    }
                    uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + local_58 >> 4;
                    if (0x1e < uVar25) {
                      uVar25 = 0x1f;
                    }
                    uVar9 = (uVar1 >> 10) * uVar12 + local_50;
                    break;
                  case 3:
                    uVar14 = (uVar9 & 0x1f) * uVar12 + iVar21 >> 4;
                    if (0x1e < uVar14) {
                      uVar14 = 0x1f;
                    }
                    uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + iVar22 >> 4;
                    if (0x1e < uVar25) {
                      uVar25 = 0x1f;
                    }
                    uVar9 = (uVar1 >> 10) * uVar12 + iVar18;
                  }
                  uVar9 = uVar9 >> 4;
                  if (0x1e < uVar9) {
                    uVar9 = 0x1f;
                  }
                  uVar25 = uVar14 | uVar9 << 10 | uVar25 << 5;
                }
                else {
switchD_0011aeaf_caseD_11aeb1:
                  uVar14 = (uVar1 & 0x1f) * uVar7 + (uVar26 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar14) {
                    uVar14 = 0x1f;
                  }
                  uVar25 = (uVar1 >> 5 & 0x1f) * uVar7 + (uVar26 >> 5 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar25) {
                    uVar25 = 0x1f;
                  }
                  uVar9 = (uVar1 >> 10) * uVar7 + (uVar26 >> 10 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar9) {
                    uVar9 = 0x1f;
                  }
                  uVar25 = uVar9 << 10 | uVar25 << 5 | uVar14;
                }
                iVar23 = 4;
                uVar14 = (uint)uVar1;
              }
            }
            bVar30 = uVar20 != 0;
            uVar20 = uVar20 - 1;
          } while (bVar30);
          local_40[local_38][uVar29].a = 0xff;
          local_40[local_38][uVar29].r = ((byte)uVar25 & 7) + (byte)uVar25 * '\b';
          bVar15 = (byte)((uVar25 & 0xffff) >> 5);
          local_40[local_38][uVar29].g = (bVar15 & 7) + bVar15 * '\b';
          bVar15 = (byte)((uVar25 & 0xffff) >> 10);
          local_40[local_38][uVar29].b = (bVar15 & 7) + bVar15 * '\b';
          uVar29 = uVar29 + 1;
          uVar20 = local_38;
        } while (uVar29 != 0xf0);
        break;
      case 2:
        if ((uVar6 >> 0xc & 1) != 0) {
          render_obj(ppu);
          uVar17 = (uint)(ppu->DISPCNT).raw;
          uVar8 = extraout_EAX;
        }
        pgVar19 = local_80;
        if ((uVar17 >> 10 & 1) != 0) {
          uVar17._0_2_ = ppu->WININ;
          uVar17._2_2_ = ppu->WINOUT;
          auVar31 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),5);
          auVar45 = ZEXT816(0x4040000040400);
          sVar60 = auVar45._6_2_;
          auVar49._0_12_ = auVar45._0_12_;
          auVar49._12_2_ = sVar60;
          auVar49._14_2_ = sVar60;
          sVar59 = auVar45._4_2_;
          auVar48._12_4_ = auVar49._12_4_;
          auVar48._0_10_ = auVar45._0_10_;
          auVar48._10_2_ = sVar59;
          auVar47._10_6_ = auVar48._10_6_;
          auVar47._8_2_ = sVar59;
          auVar47._0_8_ = 0x4040000040400;
          sVar58 = auVar45._2_2_;
          auVar46._8_8_ = auVar47._8_8_;
          auVar46._6_2_ = sVar58;
          auVar46._4_2_ = sVar58;
          auVar46._0_2_ = auVar45._0_2_;
          auVar46._2_2_ = auVar46._0_2_;
          auVar33._0_12_ = auVar31._0_12_;
          auVar33._12_2_ = auVar31._6_2_;
          auVar33._14_2_ = auVar31._6_2_;
          auVar32._12_4_ = auVar33._12_4_;
          auVar32._0_10_ = auVar31._0_10_;
          auVar32._10_2_ = auVar31._4_2_;
          auVar45._10_6_ = auVar32._10_6_;
          auVar45._0_8_ = auVar31._0_8_;
          auVar45._8_2_ = auVar31._4_2_;
          auVar34._8_8_ = auVar45._8_8_;
          auVar34._6_2_ = auVar31._2_2_;
          auVar34._4_2_ = auVar31._2_2_;
          auVar34._0_2_ = auVar31._0_2_;
          auVar34._2_2_ = auVar34._0_2_;
          auVar34 = auVar34 & auVar46;
          auVar31._0_2_ = -(ushort)(auVar34._0_2_ == auVar46._0_2_);
          auVar31._2_2_ = -(ushort)(auVar34._2_2_ == auVar46._0_2_);
          auVar31._4_2_ = -(ushort)(auVar34._4_2_ == sVar58);
          auVar31._6_2_ = -(ushort)(auVar34._6_2_ == sVar58);
          auVar31._8_2_ = -(ushort)(auVar34._8_2_ == sVar59);
          auVar31._10_2_ = -(ushort)(auVar34._10_2_ == sVar59);
          auVar31._12_2_ = -(ushort)(auVar34._12_2_ == sVar60);
          auVar31._14_2_ = -(ushort)(auVar34._14_2_ == sVar60);
          uVar8 = movmskps(uVar8,auVar31);
          bVar15 = (byte)uVar8;
          render_bg_affine(local_80,ppu->bgbuf + 2,&ppu->BG2CNT,(_Bool)(bVar15 >> 3),
                           (_Bool)((bVar15 & 4) >> 2),(_Bool)((bVar15 & 2) >> 1),(_Bool)(bVar15 & 1)
                           ,&ppu->BG2X,&ppu->BG2Y,&ppu->BG2PA,in_stack_ffffffffffffff28,
                           &local_80->BG2PC,in_stack_ffffffffffffff38);
          uVar17 = (uint)(pgVar19->DISPCNT).raw;
          ppu = pgVar19;
          uVar8 = extraout_EAX_00;
        }
        pgVar19 = local_80;
        if ((uVar17 >> 0xb & 1) != 0) {
          uVar7._0_2_ = ppu->WININ;
          uVar7._2_2_ = ppu->WINOUT;
          auVar31 = pshuflw(ZEXT416(uVar7),ZEXT416(uVar7),5);
          auVar45 = ZEXT816(0x8080000080800);
          sVar60 = auVar45._6_2_;
          auVar53._0_12_ = auVar45._0_12_;
          auVar53._12_2_ = sVar60;
          auVar53._14_2_ = sVar60;
          sVar59 = auVar45._4_2_;
          auVar52._12_4_ = auVar53._12_4_;
          auVar52._0_10_ = auVar45._0_10_;
          auVar52._10_2_ = sVar59;
          auVar51._10_6_ = auVar52._10_6_;
          auVar51._8_2_ = sVar59;
          auVar51._0_8_ = 0x8080000080800;
          sVar58 = auVar45._2_2_;
          auVar50._8_8_ = auVar51._8_8_;
          auVar50._6_2_ = sVar58;
          auVar50._4_2_ = sVar58;
          auVar50._0_2_ = auVar45._0_2_;
          auVar50._2_2_ = auVar50._0_2_;
          auVar37._0_12_ = auVar31._0_12_;
          auVar37._12_2_ = auVar31._6_2_;
          auVar37._14_2_ = auVar31._6_2_;
          auVar36._12_4_ = auVar37._12_4_;
          auVar36._0_10_ = auVar31._0_10_;
          auVar36._10_2_ = auVar31._4_2_;
          auVar35._10_6_ = auVar36._10_6_;
          auVar35._0_8_ = auVar31._0_8_;
          auVar35._8_2_ = auVar31._4_2_;
          auVar38._8_8_ = auVar35._8_8_;
          auVar38._6_2_ = auVar31._2_2_;
          auVar38._4_2_ = auVar31._2_2_;
          auVar38._0_2_ = auVar31._0_2_;
          auVar38._2_2_ = auVar38._0_2_;
          auVar38 = auVar38 & auVar50;
          auVar39._0_2_ = -(ushort)(auVar38._0_2_ == auVar50._0_2_);
          auVar39._2_2_ = -(ushort)(auVar38._2_2_ == auVar50._0_2_);
          auVar39._4_2_ = -(ushort)(auVar38._4_2_ == sVar58);
          auVar39._6_2_ = -(ushort)(auVar38._6_2_ == sVar58);
          auVar39._8_2_ = -(ushort)(auVar38._8_2_ == sVar59);
          auVar39._10_2_ = -(ushort)(auVar38._10_2_ == sVar59);
          auVar39._12_2_ = -(ushort)(auVar38._12_2_ == sVar60);
          auVar39._14_2_ = -(ushort)(auVar38._14_2_ == sVar60);
          uVar8 = movmskps(uVar8,auVar39);
          bVar15 = (byte)uVar8;
          render_bg_affine(local_80,ppu->bgbuf + 3,&ppu->BG3CNT,(_Bool)(bVar15 >> 3),
                           (_Bool)((bVar15 & 4) >> 2),(_Bool)((bVar15 & 2) >> 1),(_Bool)(bVar15 & 1)
                           ,&ppu->BG3X,&ppu->BG3Y,&ppu->BG3PA,in_stack_ffffffffffffff28,
                           &local_80->BG3PC,in_stack_ffffffffffffff38);
          ppu = pgVar19;
        }
        uVar29 = 0;
        dbg_line_drawn();
        refresh_background_priorities(ppu);
        uVar7 = (ppu->BLDALPHA).raw & 0x1f;
        uVar17 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
        local_4c = (ppu->BLDY).raw & 0x1f;
        if (0xf < (ushort)local_4c) {
          local_4c = 0x10;
        }
        bVar15 = (byte)((ppu->DISPCNT).raw >> 8);
        local_98[0] = bVar15 & 1;
        local_98[1] = bVar15 >> 1 & 1;
        local_98[2] = bVar15 >> 2 & 1;
        local_98[3] = bVar15 >> 3 & 1;
        bVar15 = (byte)(ppu->BLDCNT).raw;
        local_8e[0] = bVar15 & 1;
        local_8e[1] = bVar15 >> 1 & 1;
        local_8e[2] = bVar15 >> 2 & 1;
        local_8e[3] = bVar15 >> 3 & 1;
        local_8a = bVar15 >> 4 & 1;
        local_89 = bVar15 >> 5 & 1;
        bVar15 = (byte)((ppu->BLDCNT).raw >> 8);
        local_94[0] = bVar15 & 1;
        local_94[1] = bVar15 >> 1 & 1;
        local_94[2] = bVar15 >> 2 & 1;
        local_94[3] = bVar15 >> 3 & 1;
        local_90 = bVar15 >> 4 & 1;
        local_8f = bVar15 >> 5 & 1;
        local_72 = *(ushort *)ppu->pram;
        local_38 = (ulong)ppu->y;
        uVar12 = (uint)(byte)(0x10 - (char)local_4c);
        if (0xf < (ushort)uVar17) {
          uVar17 = 0x10;
        }
        if (0xf < (ushort)uVar7) {
          uVar7 = 0x10;
        }
        local_40 = ppu->screen;
        pgVar19 = ppu;
        uVar20 = local_38;
        do {
          uVar6 = (ushort)uVar20;
          if ((byte)(pgVar19->WIN0H).raw < uVar29 || uVar29 < (pgVar19->WIN0H).raw >> 8) {
            bVar30 = false;
          }
          else {
            bVar30 = uVar6 <= ((pgVar19->WIN0V).raw & 0xff) && (pgVar19->WIN0V).raw >> 8 <= uVar6;
          }
          if ((byte)(pgVar19->WIN1H).raw < uVar29 || uVar29 < (pgVar19->WIN1H).raw >> 8) {
            bVar11 = false;
          }
          else {
            bVar11 = uVar6 <= ((pgVar19->WIN1V).raw & 0xff) && (pgVar19->WIN1V).raw >> 8 <= uVar6;
          }
          uVar6 = local_48->raw;
          bVar15 = (byte)(uVar6 >> 8);
          if ((bVar15 >> 5 & 1 & bVar30) == 1) {
            bVar15 = *(byte *)&pgVar19->WININ;
LAB_00119c49:
            uVar27 = (ushort)(bVar15 >> 5);
          }
          else {
            if ((bVar15 >> 6 & 1 & bVar11) == 1) {
              uVar27 = (pgVar19->WININ).raw;
            }
            else {
              if (((short)uVar6 < 0 & pgVar19->obj_window[uVar29]) != 1) {
                uVar27 = 1;
                if ((uVar6 & 0x6000) != 0 && (bVar30 == false && bVar11 == false)) {
                  bVar15 = *(byte *)&pgVar19->WINOUT;
                  goto LAB_00119c49;
                }
                goto LAB_00119c8f;
              }
              uVar27 = (pgVar19->WINOUT).raw;
            }
            uVar27 = uVar27 >> 0xd;
          }
LAB_00119c8f:
          uVar6 = (pgVar19->BLDCNT).raw;
          uVar13 = uVar6 >> 6 & 3;
          p_Var5 = pgVar19->obj_alpha;
          local_60 = CONCAT71(local_60._1_7_,p_Var5[uVar29]);
          local_70 = CONCAT44(local_70._4_4_,(uint)uVar6) & 0xffffffff000000c0;
          iVar21 = (black.raw & 0x1f) * local_4c;
          iVar22 = (black.raw >> 5 & 0x1f) * local_4c;
          iVar18 = (black.raw >> 10 & 0x1f) * local_4c;
          local_54 = (white.raw & 0x1f) * local_4c;
          local_58 = (white.raw >> 5 & 0x1f) * local_4c;
          local_50 = (white.raw >> 10 & 0x1f) * local_4c;
          iVar23 = 5;
          uVar20 = 3;
          local_68 = (ulong)uVar13;
          uVar25 = (uint)local_72;
          uVar14 = (uint)local_72;
          local_88 = uVar29;
          do {
            iVar4 = background_priorities[uVar20];
            bVar15 = local_94[iVar23];
            local_bc._0_1_ = (char)uVar6;
            if ((uVar27 & 1) == 0) {
              bVar24 = (char)local_bc < '\0' | bVar15;
              uVar1 = ppu->bgbuf[iVar4][uVar29].raw;
              uVar9 = (uint)uVar1;
              bVar28 = -1 < (short)uVar1 & local_98[iVar4];
joined_r0x00119eba:
              uVar26 = uVar14;
              if (bVar28 != 0) {
                uVar26 = uVar9;
                iVar23 = iVar4;
                uVar25 = uVar9;
              }
            }
            else {
              bVar24 = (char)local_bc < '\0' | bVar15;
              uVar1 = ppu->bgbuf[iVar4][uVar29].raw;
              uVar9 = (uint)uVar1;
              bVar28 = -1 < (short)uVar1 & local_98[iVar4];
              pgVar19 = local_80;
              if (((bVar28 != 1) || (local_8e[iVar4] == 0)) ||
                 ((char)local_bc >= '\0' && ((short)local_70 == 0x40 & bVar15) == 0))
              goto joined_r0x00119eba;
              uVar26 = (uint)uVar1;
              switch(uVar13) {
              case 0:
                ppu_hblank_cold_2();
                goto switchD_00119473_caseD_11b0ac;
              case 1:
                uVar25 = (uVar26 & 0x1f) * uVar7 + (uVar14 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 5 & 0x1f) * uVar7 + (uVar14 >> 5 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar9) {
                  uVar9 = 0x1f;
                }
                uVar14 = (uVar1 >> 10) * uVar7 + (uVar14 >> 10 & 0x1f) * uVar17 >> 4;
                if (0x1e < (ushort)uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = uVar14 << 10 | uVar9 << 5 | uVar25;
                iVar23 = iVar4;
                goto LAB_00119fde;
              case 2:
                uVar14 = (uVar9 & 0x1f) * uVar12 + local_54 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + local_58 >> 4;
                if (0x1e < uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 10) * uVar12 + local_50;
                break;
              case 3:
                uVar14 = (uVar9 & 0x1f) * uVar12 + iVar21 >> 4;
                if (0x1e < uVar14) {
                  uVar14 = 0x1f;
                }
                uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + iVar22 >> 4;
                if (0x1e < uVar25) {
                  uVar25 = 0x1f;
                }
                uVar9 = (uVar1 >> 10) * uVar12 + iVar18;
              }
              uVar9 = uVar9 >> 4;
              if (0x1e < uVar9) {
                uVar9 = 0x1f;
              }
              uVar25 = uVar14 | uVar9 << 10 | uVar25 << 5;
              iVar23 = iVar4;
            }
LAB_00119fde:
            uVar14 = uVar26;
            if (uVar20 == pgVar19->obj_priorities[uVar29]) {
              uVar1 = pgVar19->objbuf[uVar29].raw;
              bVar30 = -1 < (short)uVar1;
              uVar9 = (uint)uVar1;
              if (bVar30) {
                uVar25 = uVar9;
              }
              if (bVar30) {
                uVar14 = uVar9;
                iVar23 = 4;
              }
              if ((bVar30 & p_Var5[uVar29] & bVar24) == 1) {
                if (bVar15 == 0) {
                  switch(uVar13) {
                  case 0:
                    goto switchD_0011a040_caseD_11b0bb;
                  case 1:
                    goto switchD_0011a040_caseD_11a042;
                  case 2:
                    uVar14 = (uVar1 & 0x1f) * uVar12 + local_54 >> 4;
                    if (0x1e < uVar14) {
                      uVar14 = 0x1f;
                    }
                    uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + local_58 >> 4;
                    if (0x1e < uVar25) {
                      uVar25 = 0x1f;
                    }
                    uVar9 = (uVar1 >> 10) * uVar12 + local_50;
                    break;
                  case 3:
                    uVar14 = (uVar9 & 0x1f) * uVar12 + iVar21 >> 4;
                    if (0x1e < uVar14) {
                      uVar14 = 0x1f;
                    }
                    uVar25 = (uVar1 >> 5 & 0x1f) * uVar12 + iVar22 >> 4;
                    if (0x1e < uVar25) {
                      uVar25 = 0x1f;
                    }
                    uVar9 = (uVar1 >> 10) * uVar12 + iVar18;
                  }
                  uVar9 = uVar9 >> 4;
                  if (0x1e < uVar9) {
                    uVar9 = 0x1f;
                  }
                  uVar25 = uVar14 | uVar9 << 10 | uVar25 << 5;
                }
                else {
switchD_0011a040_caseD_11a042:
                  uVar14 = (uVar1 & 0x1f) * uVar7 + (uVar26 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar14) {
                    uVar14 = 0x1f;
                  }
                  uVar25 = (uVar1 >> 5 & 0x1f) * uVar7 + (uVar26 >> 5 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar25) {
                    uVar25 = 0x1f;
                  }
                  uVar9 = (uVar1 >> 10) * uVar7 + (uVar26 >> 10 & 0x1f) * uVar17 >> 4;
                  if (0x1e < (ushort)uVar9) {
                    uVar9 = 0x1f;
                  }
                  uVar25 = uVar9 << 10 | uVar25 << 5 | uVar14;
                }
                iVar23 = 4;
                uVar14 = (uint)uVar1;
              }
            }
            bVar30 = uVar20 != 0;
            uVar20 = uVar20 - 1;
          } while (bVar30);
          local_40[local_38][uVar29].a = 0xff;
          local_40[local_38][uVar29].r = ((byte)uVar25 & 7) + (byte)uVar25 * '\b';
          bVar15 = (byte)((uVar25 & 0xffff) >> 5);
          local_40[local_38][uVar29].g = (bVar15 & 7) + bVar15 * '\b';
          bVar15 = (byte)((uVar25 & 0xffff) >> 10);
          local_40[local_38][uVar29].b = (bVar15 & 7) + bVar15 * '\b';
          uVar29 = uVar29 + 1;
          uVar20 = local_38;
        } while (uVar29 != 0xf0);
        break;
      case 3:
        render_line_mode3(ppu);
        return;
      case 4:
        render_line_mode4(ppu);
        return;
      }
    }
  }
  return;
switchD_00119473_caseD_11b0ac:
  ppu_hblank_cold_6();
switchD_0011ac53_caseD_11b0b1:
  ppu_hblank_cold_4();
switchD_001196cf_caseD_11b0b6:
  ppu_hblank_cold_5();
switchD_0011a040_caseD_11b0bb:
  ppu_hblank_cold_1();
switchD_0011aeaf_caseD_11b0c0:
  ppu_hblank_cold_3();
LAB_0011b0c5:
  pDVar10 = local_48;
  ppu_hblank_cold_7();
  dma_start_trigger(VBlank);
  uVar6 = pDVar10[0xfb33].raw;
  if ((uVar6 & 8) != 0) {
    request_interrupt(IRQ_VBLANK);
    uVar6 = pDVar10[0xfb33].raw;
  }
  pDVar10[0xfb33].raw = uVar6 | 1;
  render_screen((color_t (*) [160] [240])((long)pDVar10 + 2));
  return;
}

Assistant:

void ppu_hblank(gba_ppu_t* ppu) {
    if (!is_vblank(ppu)) {
        dma_start_trigger(HBlank);
    }
    if (ppu->DISPSTAT.hblank_irq_enable) {
        request_interrupt(IRQ_HBLANK);
    }
    ppu->DISPSTAT.hblank = true;
    if (ppu->y < GBA_SCREEN_Y && !ppu->DISPCNT.forced_blank) { // i.e. not VBlank
        render_line(ppu);
    }
}